

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O3

void mserialize::detail::
     BuiltinSerializer<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_void>
     ::serialize_elems<binlog::detail::QueueWriter>(long param_1,undefined8 param_2,long param_3)

{
  long lVar1;
  _Rb_tree_node_base *p_Var2;
  _Rb_tree_color *p_Var3;
  
  p_Var2 = *(_Rb_tree_node_base **)(param_1 + 0x18);
  if (p_Var2 != (_Rb_tree_node_base *)(param_1 + 8)) {
    p_Var3 = *(_Rb_tree_color **)(param_3 + 8);
    do {
      *p_Var3 = p_Var2[1]._M_color;
      lVar1 = *(long *)(param_3 + 8);
      *(long *)(param_3 + 8) = lVar1 + 4;
      *(undefined4 *)(lVar1 + 4) = *(undefined4 *)&p_Var2[1].field_0x4;
      p_Var3 = (_Rb_tree_color *)(*(long *)(param_3 + 8) + 4);
      *(_Rb_tree_color **)(param_3 + 8) = p_Var3;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
    } while (p_Var2 != (_Rb_tree_node_base *)(param_1 + 8));
  }
  return;
}

Assistant:

static void serialize_elems(
    std::false_type /* no batch copy */,
    const Sequence& s, std::uint32_t /* size */, OutputStream& ostream
  )
  {
    for (auto&& elem : s)
    {
      mserialize::serialize<value_type>(elem, ostream);
    }
  }